

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moduleexecutors.cpp
# Opt level: O0

bool __thiscall
trun::TestModuleExecutorSequential::Execute
          (TestModuleExecutorSequential *this,Ref *library,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
          *testModules)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Log *this_01;
  undefined1 uVar1;
  CBPrePostHook this_02;
  bool bVar2;
  kRunResultAction kVar3;
  ILogger *pIVar4;
  reference __in;
  type *__x;
  iterator iVar5;
  iterator iVar6;
  Config *this_03;
  reference __str;
  size_type sVar7;
  reference pvVar8;
  __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_04;
  element_type *peVar9;
  char *arguments_1;
  element_type *this_05;
  shared_ptr<trun::TestModule> local_190;
  undefined1 local_180 [8];
  Ref result;
  shared_ptr<trun::TestModule> *testModule;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  *__range2;
  shared_ptr<trun::TestModule> local_138;
  undefined1 local_128 [8];
  value_type tmToRemove;
  undefined1 local_110 [4];
  kMatchResult matchResult;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  matches;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argModuleName;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  type *v;
  type *k;
  undefined1 local_90 [8];
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
  *__range1;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  testModulesList;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  CBPrePostHook CStack_20;
  bool bRes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
  *testModules_local;
  Ref *library_local;
  TestModuleExecutorSequential *this_local;
  
  local_21 = 1;
  CStack_20 = (CBPrePostHook)testModules;
  testModules_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
        *)library;
  library_local = (Ref *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"TestModExeSeq",&local_49);
  pIVar4 = gnilk::Logger::GetLogger(&local_48);
  *(ILogger **)&this->field_0x8 = pIVar4;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
  vector((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          *)&__range1);
  this_02 = CStack_20;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
                    *)CStack_20.cbHookV1);
  local_90 = (undefined1  [8])
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
                    *)this_02.cbHookV1);
  while (bVar2 = std::operator==(&__end1,(_Self *)local_90), ((bVar2 ^ 0xffU) & 1) != 0) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>
           ::operator*(&__end1);
    std::get<0ul,std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>(__in);
    __x = std::get<1ul,std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>(__in);
    std::
    vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
    push_back((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               *)&__range1,__x);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>
    ::operator++(&__end1);
  }
  iVar5 = std::
          vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ::begin((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   *)&__range1);
  iVar6 = std::
          vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ::end((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>
            (iVar5._M_current,iVar6._M_current);
  this_03 = Config::Instance();
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this_03->modules);
  argModuleName.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this_03->modules);
  do {
    bVar2 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&argModuleName.field_2 + 8));
    uVar1 = local_21;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::~vector((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 *)&__range1);
      return (bool)(uVar1 & 1);
    }
    __str = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_1);
    std::__cxx11::string::string
              ((string *)
               &matches.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__str);
    std::
    vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
    vector((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
            *)local_110);
    tmToRemove.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = ModuleMatch((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                         *)local_110,
                        (string *)
                        &matches.
                         super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                         *)&__range1);
    if (tmToRemove.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ == NegativeSingle) {
      sVar7 = std::
              vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
              ::size((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                      *)local_110);
      if (sVar7 != 1) {
        __assert_fail("matches.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/moduleexecutors.cpp"
                      ,0x86,
                      "virtual bool trun::TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &, const std::map<std::string, TestModule::Ref> &)"
                     );
      }
      pvVar8 = std::
               vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ::operator[]((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             *)local_110,0);
      std::shared_ptr<trun::TestModule>::shared_ptr
                ((shared_ptr<trun::TestModule> *)local_128,pvVar8);
      std::shared_ptr<trun::TestModule>::shared_ptr
                (&local_138,(shared_ptr<trun::TestModule> *)local_128);
      std::
      erase_if<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>,trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                ((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                  *)&__range1,(anon_class_16_1_07491e36_for__M_pred *)&local_138);
      Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)
      ::$_1::~__1((__1 *)&local_138);
      std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_128);
    }
    else {
      __end2 = std::
               vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ::begin((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                        *)local_110);
      testModule = (shared_ptr<trun::TestModule> *)
                   std::
                   vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                   ::end((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                          *)local_110);
      while (bVar2 = __gnu_cxx::
                     operator==<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
                               (&__end2,(__normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
                                         *)&testModule), ((bVar2 ^ 0xffU) & 1) != 0) {
        this_04 = (__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
                   ::operator*(&__end2);
        peVar9 = std::
                 __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_04);
        bVar2 = TestModule::IsIdle(peVar9);
        if (bVar2) {
          this_01 = *(Log **)&this->field_0x8;
          peVar9 = std::
                   __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_04);
          arguments_1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                  (&peVar9->name);
          gnilk::Log::Info<char_const*,char_const*>
                    (this_01,"Executing tests for library: %s",arguments_1);
          this_00 = &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::shared_ptr<trun::TestModule>::shared_ptr
                    ((shared_ptr<trun::TestModule> *)this_00,(shared_ptr<trun::TestModule> *)this_04
                    );
          TestRunner::SetCurrentTestModule((Ref *)this_00);
          std::shared_ptr<trun::TestModule>::~shared_ptr
                    ((shared_ptr<trun::TestModule> *)
                     &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar9 = std::
                   __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_04);
          TestModule::Execute((TestModule *)local_180,(Ref *)peVar9);
          bVar2 = std::operator==((shared_ptr<trun::TestResult> *)local_180,(nullptr_t)0x0);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_00141f77:
            std::shared_ptr<trun::TestModule>::shared_ptr(&local_190,(nullptr_t)0x0);
            TestRunner::SetCurrentTestModule(&local_190);
            std::shared_ptr<trun::TestModule>::~shared_ptr(&local_190);
            __range2._4_4_ = 0;
          }
          else {
            this_05 = std::
                      __shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_180);
            kVar3 = TestResult::CheckIfContinue(this_05);
            if (kVar3 != kAbortAll) goto LAB_00141f77;
            __range2._4_4_ = 6;
          }
          std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_180);
          if (__range2._4_4_ != 0) break;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
        ::operator++(&__end2);
      }
    }
    std::
    vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
    ~vector((vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
             *)local_110);
    std::__cxx11::string::~string
              ((string *)
               &matches.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &library, const std::map<std::string, TestModule::Ref> &testModules) {
    bool bRes = true;
    pLogger = gnilk::Logger::GetLogger("TestModExeSeq");

    // Convert to vector and sort..
    std::vector<TestModule::Ref> testModulesList;
    for(auto &[k,v] : testModules) {
        testModulesList.push_back(v);
    }
    std::sort(testModulesList.begin(), testModulesList.end(), [](const TestModule::Ref &a, const TestModule::Ref &b) {
        return (a->name < b->name);
    });


    // For every argument on the command line
    for(auto argModuleName : Config::Instance().modules) {
        // Match cases
        std::vector<TestModule::Ref> matches;
        auto matchResult = ModuleMatch(matches, argModuleName, testModulesList);
        // In case this is negative (i.e. don't execute) we remove it from the sorted LOCAL list
        // NOTE: DO NOT change the state - if can be that another module depends on this one - in that case we need to execute...
        if (matchResult == kMatchResult::NegativeSingle) {
            assert(matches.size() == 1);
            auto tmToRemove = matches[0];
            // Remove this from the execution list...
            std::erase_if(testModulesList,[tmToRemove](const TestModule::Ref &m)->bool{
               return (tmToRemove->name == m->name);
            });
            continue;
        }

        // If here, we should execute anything in the matches list...
        for(auto &testModule : matches) {
            // Already executed?
            if (!testModule->IsIdle()) {
                //pLogger->Debug("Tests for '%s' already executed, skipping",testModule->name.c_str());
                continue;
            }

            pLogger->Info("Executing tests for library: %s", testModule->name.c_str());

            TestRunner::SetCurrentTestModule(testModule);
            auto result = testModule->Execute(library);
            if ((result != nullptr) && (result->CheckIfContinue() == TestResult::kRunResultAction::kAbortAll)) {
                break;
            }
            TestRunner::SetCurrentTestModule(nullptr);
        } // for modules

    }

    return bRes;
}